

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_bbox_scale(REF_DBL *bbox0,REF_DBL factor,REF_DBL *bbox1)

{
  REF_DBL *bbox1_local;
  REF_DBL factor_local;
  REF_DBL *bbox0_local;
  
  *bbox1 = -((factor - 1.0) * 0.5) * (bbox0[1] - *bbox0) + *bbox0;
  bbox1[1] = (factor - 1.0) * 0.5 * (bbox0[1] - *bbox0) + bbox0[1];
  bbox1[2] = -((factor - 1.0) * 0.5) * (bbox0[3] - bbox0[2]) + bbox0[2];
  bbox1[3] = (factor - 1.0) * 0.5 * (bbox0[3] - bbox0[2]) + bbox0[3];
  bbox1[4] = -((factor - 1.0) * 0.5) * (bbox0[5] - bbox0[4]) + bbox0[4];
  bbox1[5] = (factor - 1.0) * 0.5 * (bbox0[5] - bbox0[4]) + bbox0[5];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_bbox_scale(REF_DBL *bbox0, REF_DBL factor,
                                      REF_DBL *bbox1) {
  bbox1[0] = bbox0[0] - 0.5 * (factor - 1.0) * (bbox0[1] - bbox0[0]);
  bbox1[1] = bbox0[1] + 0.5 * (factor - 1.0) * (bbox0[1] - bbox0[0]);
  bbox1[2] = bbox0[2] - 0.5 * (factor - 1.0) * (bbox0[3] - bbox0[2]);
  bbox1[3] = bbox0[3] + 0.5 * (factor - 1.0) * (bbox0[3] - bbox0[2]);
  bbox1[4] = bbox0[4] - 0.5 * (factor - 1.0) * (bbox0[5] - bbox0[4]);
  bbox1[5] = bbox0[5] + 0.5 * (factor - 1.0) * (bbox0[5] - bbox0[4]);
  return REF_SUCCESS;
}